

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O1

void __thiscall cmCTestHG::StatusParser::StatusParser(StatusParser *this,cmCTestHG *hg,char *prefix)

{
  cmProcessTools::LineParser::LineParser(&this->super_LineParser,'\n',true);
  (this->super_LineParser).super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__StatusParser_00bda3f8;
  this->HG = hg;
  (this->RegexStatus).regmust = (char *)0x0;
  (this->RegexStatus).program = (char *)0x0;
  (this->RegexStatus).progsize = 0;
  memset(&this->RegexStatus,0,0x20a);
  cmProcessTools::LineParser::SetLog
            (&this->super_LineParser,(hg->super_cmCTestGlobalVC).super_cmCTestVC.Log,prefix);
  cmsys::RegularExpression::compile(&this->RegexStatus,"([MARC!?I]) (.*)");
  return;
}

Assistant:

StatusParser(cmCTestHG* hg, const char* prefix)
    : HG(hg)
  {
    this->SetLog(&hg->Log, prefix);
    this->RegexStatus.compile("([MARC!?I]) (.*)");
  }